

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi_io.c
# Opt level: O3

unsigned_long
kvtree_write_gather_map
          (char *prefix,char *file,unsigned_long offset,int level,int valid,MPI_Comm comm)

{
  mode_t mVar1;
  int fd;
  kvtree *pkVar2;
  size_t sVar3;
  kvtree *send_hash;
  kvtree *recv_00;
  unsigned_long uVar4;
  ssize_t sVar5;
  unsigned_long uVar6;
  uint uVar7;
  undefined4 in_register_00000084;
  MPI_Comm comm_00;
  MPI_Comm comm_01;
  int allranks;
  int rank_world;
  kvtree *recv;
  int writer;
  int ranks_world;
  kvtree *send;
  kvtree *save;
  kvtree *hash;
  size_t bufsize;
  void *buf;
  char mappath [1024];
  char mapfile [1024];
  int local_880;
  uint local_87c;
  unsigned_long local_878;
  kvtree *local_870;
  uint local_868;
  int local_864;
  kvtree *local_860;
  kvtree *local_858;
  kvtree *local_850;
  size_t local_848;
  void *local_840;
  char local_838 [1024];
  char local_438 [1032];
  
  comm_00 = (MPI_Comm)CONCAT44(in_register_00000084,valid);
  comm_01 = comm_00;
  local_878 = offset;
  MPI_Comm_rank(comm_00,&local_87c);
  MPI_Comm_size(comm_00,&local_864);
  pkVar2 = kvtree_new();
  local_850 = pkVar2;
  if (level == 0) {
    pick_writer(0,(unsigned_long)&local_868,&local_880,(int *)comm_00,comm_01);
    send_hash = kvtree_new();
    local_860 = send_hash;
    recv_00 = kvtree_new();
    uVar7 = local_868;
    local_870 = recv_00;
  }
  else {
    kvtree_util_set_str(pkVar2,"FILE",file);
    kvtree_util_set_bytecount(pkVar2,"OFFSET",0);
    sVar3 = kvtree_pack_size(pkVar2);
    pick_writer((int)sVar3,(unsigned_long)&local_868,&local_880,(int *)comm_00,comm_01);
    send_hash = kvtree_new();
    local_860 = send_hash;
    recv_00 = kvtree_new();
    local_870 = recv_00;
    kvtree_exchange_sendq(send_hash,local_868,pkVar2);
    uVar7 = local_868;
  }
  kvtree_delete(&local_850);
  kvtree_exchange_direction(send_hash,recv_00,comm_00,KVTREE_EXCHANGE_LEFT);
  pkVar2 = kvtree_new();
  local_858 = pkVar2;
  if (local_87c == uVar7) {
    kvtree_set(pkVar2,"RANK",recv_00);
    local_870 = (kvtree *)0x0;
  }
  kvtree_delete(&local_870);
  kvtree_delete(&local_860);
  if (local_880 == 0) {
    snprintf(local_438,0x400,".%d.%d",local_878,(ulong)uVar7);
  }
  else {
    local_438[0] = '\0';
  }
  uVar4 = 0;
  snprintf(local_838,0x400,"%s%s",prefix,local_438);
  if (local_880 == 0) {
    uVar4 = kvtree_write_gather_map
                      (prefix,local_438,(ulong)((int)local_878 + 1),(uint)(local_87c == uVar7),valid
                       ,comm);
  }
  if (local_87c == uVar7) {
    uVar6 = 1;
    mVar1 = kvtree_getmode(1,1,0);
    fd = kvtree_open(local_838,0x241,(ulong)mVar1);
    if (fd < 0) {
      kvtree_err("Opening file for write: %s @ %s:%d",local_838,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                 ,0xfc);
      goto LAB_001080fb;
    }
    kvtree_util_set_int(pkVar2,"LEVEL",(int)local_878);
    kvtree_util_set_int(pkVar2,"RANKS",local_864);
    local_840 = (void *)0x0;
    local_848 = 0;
    kvtree_write_persist(&local_840,&local_848,pkVar2);
    kvtree_lseek(local_838,fd,0,0);
    sVar5 = kvtree_write_attempt(local_838,fd,local_840,local_848);
    uVar4 = uVar4 & 0xffffffff;
    if (sVar5 < 0) {
      uVar4 = 1;
    }
    kvtree_free(&local_840);
    kvtree_close(local_838,fd);
  }
  uVar6 = uVar4 & 0xffffffff;
LAB_001080fb:
  kvtree_delete(&local_858);
  return uVar6;
}

Assistant:

static unsigned long kvtree_write_gather_map(
  const char* prefix,
  const char* file,
  unsigned long offset,
  int level,
  int valid,
  MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  if (offset != 0) {
    /*
     * While we technically can write to a non-zero offset, there were issues
     * with doing so with NFS, and so we disable it for now.  It will break
     * kvtree_read_scatter_single() if we enable it too.
     */
    kvtree_abort(1, "Attempt to write a non-zero offset (got %lu) for %s/%s @ %s:%d",
      offset, prefix, file, __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* get name of this process */
  int rank_world, ranks_world;
  MPI_Comm_rank(comm, &rank_world);
  MPI_Comm_size(comm, &ranks_world);

  /* if this process will write a file, record file name and offset */
  kvtree* hash = kvtree_new();
  unsigned long pack_size = 0;
  if (valid) {
    kvtree_util_set_str(hash, "FILE", file);
    kvtree_util_set_bytecount(hash, "OFFSET", offset);
    pack_size = (unsigned long) kvtree_pack_size(hash);
  }

  /* pick writers so that we send roughly 1MB of data to each */
  int writer, allranks;
  pick_writer(level, pack_size, &writer, &allranks, comm);

  /* create new hashes to send and receive data */
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();

  /* if we have valid values, queue it to send to writer */
  if (valid) {
    kvtree_exchange_sendq(send, writer, hash);
  }

  /* delete data hash */
  kvtree_delete(&hash);

  /* gather hash to writers */
  kvtree_exchange_direction(send, recv, comm, KVTREE_EXCHANGE_LEFT);

  /* we record incoming data in save hash for writing */
  kvtree* save = kvtree_new();
  if (rank_world == writer) {
    /* record hash containing file names indexed by rank,
     * attach received hash to save hash and set recv to NULL
     * since we no longer need to free it */
    kvtree_set(save, "RANK", recv);
    recv = NULL;
  }

  /* free send and receive hashes */
  kvtree_delete(&recv);
  kvtree_delete(&send);

  /* define file name */
  char mapfile[1024];
  if (allranks) {
    /* at the top most level, simplify the name so we can find it */
    snprintf(mapfile, sizeof(mapfile), "%s", "");
  } else {
    /* for all lower level maps we append a level id and writer id */
    snprintf(mapfile, sizeof(mapfile), ".%d.%d", level, writer);
  }

  char mappath[1024];
  snprintf(mappath, sizeof(mappath), "%s%s", prefix, mapfile);

  /* call gather recursively if there's another level */
  if (! allranks) {
     /* gather file names to higher level */
     unsigned long newoffset = 0;
     int newlevel = level + 1;
     int newvalid = 0;
     if (rank_world == writer) {
       newvalid = 1;
     }
     if (kvtree_write_gather_map(prefix, mapfile, newoffset, newlevel, newvalid, comm) != KVTREE_SUCCESS)
     {
       rc = KVTREE_FAILURE;
     }
  }

  /* write hash to file */
  if (rank_world == writer) {
    /* open the file if we need to */
    mode_t mode = kvtree_getmode(1, 1, 0);
    int fd = kvtree_open(mappath, O_WRONLY | O_CREAT | O_TRUNC, mode);
    if (fd >= 0) {
      /* store level value in hash */
      kvtree_util_set_int(save, "LEVEL", level);

      /* record global number of ranks */
      kvtree_util_set_int(save, "RANKS", ranks_world);

      /* persist hash */
      void* buf = NULL;
      size_t bufsize = 0;
      kvtree_write_persist(&buf, &bufsize, save);

      /* write data to file */
      kvtree_lseek(mappath, fd, offset, SEEK_SET);
      ssize_t write_rc = kvtree_write_attempt(mappath, fd, buf, bufsize);
      if (write_rc < 0) {
        rc = KVTREE_FAILURE;
      }

      /* free the buffer holding the persistent hash */
      kvtree_free(&buf);

      /* close the file */
      kvtree_close(mappath, fd);
    } else {
      kvtree_err("Opening file for write: %s @ %s:%d",
        mappath, __FILE__, __LINE__
      );
      rc = KVTREE_FAILURE;
    }
  }

  /* free the hash */
  kvtree_delete(&save);

  return rc;
}